

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgsrfs.c
# Opt level: O0

void cgsrfs(trans_t trans,SuperMatrix *A,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,
           char *equed,float *R,float *C,SuperMatrix *B,SuperMatrix *X,float *ferr,float *berr,
           SuperLUStat_t *stat,int *info)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  int iVar6;
  singlecomplex *cy;
  void *addr;
  int *addr_00;
  long lVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double local_3c8;
  double local_3b0;
  double local_390;
  double local_378;
  double local_368;
  int local_348;
  int local_340;
  char local_338 [8];
  char msg_1 [256];
  char msg [256];
  int isave [3];
  int *iwork;
  float *rwork;
  singlecomplex *work;
  trans_t transt;
  float fStack_104;
  char transc [1];
  float safmin;
  float eps;
  float lstres;
  float xk;
  float s;
  int nrhs;
  int ldx;
  int ldb;
  int colequ;
  int rowequ;
  int notran;
  int count;
  int nz;
  int irow;
  int k;
  int j;
  int i;
  float safe2;
  float safe1;
  int kase;
  singlecomplex *Xptr;
  singlecomplex *Bptr;
  singlecomplex *Xmat;
  singlecomplex *Bmat;
  DNformat *Bjcol_store;
  DNformat *Xstore;
  DNformat *Bstore;
  SuperMatrix Bjcol;
  singlecomplex *Aval;
  NCformat *Astore;
  singlecomplex done;
  singlecomplex ndone;
  int nrow;
  int ione;
  int *perm_r_local;
  int *perm_c_local;
  SuperMatrix *U_local;
  SuperMatrix *L_local;
  SuperMatrix *A_local;
  trans_t trans_local;
  
  ndone.i = 1.4013e-45;
  ndone.r = (float)A->nrow;
  done.r = -1.0;
  done.i = 0.0;
  Astore = (NCformat *)0x3f800000;
  pvVar5 = A->Store;
  Bjcol.Store = *(void **)((long)pvVar5 + 8);
  Xstore = (DNformat *)B->Store;
  Bjcol_store = (DNformat *)X->Store;
  Xmat = (singlecomplex *)Xstore->nzval;
  Bptr = (singlecomplex *)Bjcol_store->nzval;
  iVar2 = Xstore->lda;
  iVar3 = Bjcol_store->lda;
  iVar4 = B->ncol;
  *info = 0;
  bVar8 = trans == NOTRANS;
  if (((bVar8) || (trans == TRANS)) || (trans == CONJ)) {
    if (((A->nrow == A->ncol) && (-1 < A->nrow)) &&
       ((A->Stype == SLU_NC && ((A->Dtype == SLU_C && (A->Mtype == SLU_GE)))))) {
      if ((((L->nrow == L->ncol) && (-1 < L->nrow)) && (L->Stype == SLU_SC)) &&
         ((L->Dtype == SLU_C && (L->Mtype == SLU_TRLU)))) {
        if (((U->nrow == U->ncol) && (-1 < U->nrow)) &&
           ((U->Stype == SLU_NC && ((U->Dtype == SLU_C && (U->Mtype == SLU_TRU)))))) {
          if (A->nrow < 0) {
            local_340 = 0;
          }
          else {
            local_340 = A->nrow;
          }
          if ((((iVar2 < local_340) || (B->Stype != SLU_DN)) || (B->Dtype != SLU_C)) ||
             (B->Mtype != SLU_GE)) {
            *info = -10;
          }
          else {
            if (A->nrow < 0) {
              local_348 = 0;
            }
            else {
              local_348 = A->nrow;
            }
            if (((iVar3 < local_348) || (X->Stype != SLU_DN)) ||
               ((X->Dtype != SLU_C || (X->Mtype != SLU_GE)))) {
              *info = -0xb;
            }
          }
        }
        else {
          *info = -4;
        }
      }
      else {
        *info = -3;
      }
    }
    else {
      *info = -2;
    }
  }
  else {
    *info = -1;
  }
  if (*info == 0) {
    if ((A->nrow == 0) || (iVar4 == 0)) {
      for (irow = 0; irow < iVar4; irow = irow + 1) {
        ferr[irow] = 0.0;
        berr[irow] = 0.0;
      }
    }
    else {
      iVar6 = strncmp(equed,"R",1);
      bVar9 = true;
      if (iVar6 != 0) {
        iVar6 = strncmp(equed,"B",1);
        bVar9 = iVar6 == 0;
      }
      iVar6 = strncmp(equed,"C",1);
      bVar10 = true;
      if (iVar6 != 0) {
        iVar6 = strncmp(equed,"B",1);
        bVar10 = iVar6 == 0;
      }
      cy = singlecomplexMalloc((long)(A->nrow << 1));
      addr = superlu_malloc((long)A->nrow << 2);
      addr_00 = int32Malloc(A->nrow);
      if (((cy == (singlecomplex *)0x0) || (addr == (void *)0x0)) || (addr_00 == (int *)0x0)) {
        sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","Malloc fails for work/rwork/iwork.",0xe3,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cgsrfs.c")
        ;
        superlu_abort_and_exit(msg_1 + 0xf8);
      }
      if (bVar8) {
        work._7_1_ = 0x4e;
        work._0_4_ = TRANS;
      }
      else if (trans == TRANS) {
        work._7_1_ = 0x54;
        work._0_4_ = NOTRANS;
      }
      else if (trans == CONJ) {
        work._7_1_ = 0x43;
        work._0_4_ = NOTRANS;
      }
      iVar6 = A->ncol;
      fStack_104 = smach("Epsilon");
      transt = (trans_t)smach("Safe minimum");
      i = (int)((float)(iVar6 + 1) * (float)transt);
      j = (int)((float)i / fStack_104);
      for (k = 0; k < A->nrow; k = k + 1) {
        addr_00[k] = 0;
      }
      if (bVar8) {
        for (nz = 0; nz < A->ncol; nz = nz + 1) {
          for (k = *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)nz * 4);
              k < *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)(nz + 1) * 4); k = k + 1) {
            iVar6 = *(int *)(*(long *)((long)pvVar5 + 0x10) + (long)k * 4);
            addr_00[iVar6] = addr_00[iVar6] + 1;
          }
        }
      }
      else {
        for (nz = 0; nz < A->ncol; nz = nz + 1) {
          addr_00[nz] = *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)(nz + 1) * 4) -
                        *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)nz * 4);
        }
      }
      Bstore._0_4_ = B->Stype;
      Bstore._4_4_ = B->Dtype;
      Bjcol.Stype = B->Mtype;
      Bjcol.Dtype = B->nrow;
      Bjcol.Mtype = SLU_TRLU;
      Bjcol._16_8_ = superlu_malloc(0x10);
      if ((void *)Bjcol._16_8_ == (void *)0x0) {
        sprintf(local_338,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for Bjcol.Store",0x10c,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cgsrfs.c")
        ;
        superlu_abort_and_exit(local_338);
      }
      Bmat = (singlecomplex *)Bjcol._16_8_;
      *(int *)Bjcol._16_8_ = iVar2;
      *(singlecomplex **)(Bjcol._16_8_ + 8) = cy;
      for (irow = 0; irow < iVar4; irow = irow + 1) {
        rowequ = 0;
        safmin = 3.0;
        Xptr = Xmat + irow * iVar2;
        _safe1 = Bptr + irow * iVar3;
        while( true ) {
          ccopy_((integer *)&ndone,Xptr,(integer *)&ndone.i,cy,(integer *)&ndone.i);
          sp_cgemv((char *)((long)&work + 7),done,A,_safe1,(int)ndone.i,(singlecomplex)Astore,cy,
                   (int)ndone.i);
          for (k = 0; k < A->nrow; k = k + 1) {
            dVar11 = c_abs1(Xptr + k);
            *(float *)((long)addr + (long)k * 4) = (float)dVar11;
          }
          if (bVar8) {
            for (nz = 0; nz < A->ncol; nz = nz + 1) {
              dVar11 = c_abs1(_safe1 + nz);
              for (k = *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)nz * 4);
                  k < *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)(nz + 1) * 4); k = k + 1) {
                dVar12 = c_abs1((singlecomplex *)((long)Bjcol.Store + (long)k * 8));
                lVar7 = (long)*(int *)(*(long *)((long)pvVar5 + 0x10) + (long)k * 4);
                *(float *)((long)addr + lVar7 * 4) =
                     (float)(dVar12 * (double)(float)dVar11 +
                            (double)*(float *)((long)addr + lVar7 * 4));
              }
            }
          }
          else {
            for (nz = 0; nz < A->ncol; nz = nz + 1) {
              lstres = 0.0;
              for (k = *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)nz * 4);
                  k < *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)(nz + 1) * 4); k = k + 1) {
                iVar6 = *(int *)(*(long *)((long)pvVar5 + 0x10) + (long)k * 4);
                dVar11 = c_abs1((singlecomplex *)((long)Bjcol.Store + (long)k * 8));
                dVar12 = c_abs1(_safe1 + iVar6);
                lstres = (float)(dVar11 * dVar12 + (double)lstres);
              }
              *(float *)((long)addr + (long)nz * 4) = lstres + *(float *)((long)addr + (long)nz * 4)
              ;
            }
          }
          lstres = 0.0;
          for (k = 0; k < A->nrow; k = k + 1) {
            if (*(float *)((long)addr + (long)k * 4) <= (float)j) {
              fVar1 = *(float *)((long)addr + (long)k * 4);
              if ((fVar1 != 0.0) || (NAN(fVar1))) {
                dVar11 = c_abs1(cy + k);
                if ((double)lstres <=
                    (dVar11 + (double)(float)i) / (double)*(float *)((long)addr + (long)k * 4)) {
                  dVar11 = c_abs1(cy + k);
                  local_378 = (dVar11 + (double)(float)i) /
                              (double)*(float *)((long)addr + (long)k * 4);
                }
                else {
                  local_378 = (double)lstres;
                }
                lstres = (float)local_378;
              }
            }
            else {
              dVar11 = c_abs1(cy + k);
              if ((double)lstres <= dVar11 / (double)*(float *)((long)addr + (long)k * 4)) {
                local_368 = c_abs1(cy + k);
                local_368 = local_368 / (double)*(float *)((long)addr + (long)k * 4);
              }
              else {
                local_368 = (double)lstres;
              }
              lstres = (float)local_368;
            }
          }
          berr[irow] = lstres;
          if (((berr[irow] <= fStack_104) || (safmin < berr[irow] * 2.0)) || (4 < rowequ)) break;
          cgstrs(trans,L,U,perm_c,perm_r,(SuperMatrix *)&Bstore,stat,info);
          caxpy_((integer *)&ndone,(singlecomplex *)&Astore,cy,(integer *)&ndone.i,
                 Bptr + irow * iVar3,(integer *)&ndone.i);
          safmin = berr[irow];
          rowequ = rowequ + 1;
        }
        stat->RefineSteps = rowequ;
        for (k = 0; k < A->nrow; k = k + 1) {
          dVar11 = c_abs1(Xptr + k);
          *(float *)((long)addr + (long)k * 4) = (float)dVar11;
        }
        if (bVar8) {
          for (nz = 0; nz < A->ncol; nz = nz + 1) {
            dVar11 = c_abs1(_safe1 + nz);
            for (k = *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)nz * 4);
                k < *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)(nz + 1) * 4); k = k + 1) {
              dVar12 = c_abs1((singlecomplex *)((long)Bjcol.Store + (long)k * 8));
              lVar7 = (long)*(int *)(*(long *)((long)pvVar5 + 0x10) + (long)k * 4);
              *(float *)((long)addr + lVar7 * 4) =
                   (float)(dVar12 * (double)(float)dVar11 +
                          (double)*(float *)((long)addr + lVar7 * 4));
            }
          }
        }
        else {
          for (nz = 0; nz < A->ncol; nz = nz + 1) {
            lstres = 0.0;
            for (k = *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)nz * 4);
                k < *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)(nz + 1) * 4); k = k + 1) {
              dVar11 = c_abs1(_safe1 + *(int *)(*(long *)((long)pvVar5 + 0x10) + (long)k * 4));
              dVar12 = c_abs1((singlecomplex *)((long)Bjcol.Store + (long)k * 8));
              lstres = (float)(dVar12 * (double)(float)dVar11 + (double)lstres);
            }
            *(float *)((long)addr + (long)nz * 4) = lstres + *(float *)((long)addr + (long)nz * 4);
          }
        }
        for (k = 0; k < A->nrow; k = k + 1) {
          if (*(float *)((long)addr + (long)k * 4) <= (float)j) {
            dVar11 = c_abs(cy + k);
            *(float *)((long)addr + (long)k * 4) =
                 (float)(dVar11 + (double)((float)(addr_00[k] + 1) * fStack_104 *
                                          *(float *)((long)addr + (long)k * 4)) + (double)(float)i);
          }
          else {
            dVar11 = c_abs(cy + k);
            *(float *)((long)addr + (long)k * 4) =
                 (float)(dVar11 + (double)((float)(addr_00[k] + 1) * fStack_104 *
                                          *(float *)((long)addr + (long)k * 4)));
          }
        }
        safe2 = 0.0;
        do {
          clacon2_((int *)&ndone,cy + A->nrow,cy,ferr + irow,(int *)&safe2,(int *)(msg + 0xfc));
          if (safe2 == 0.0) break;
          if (safe2 == 1.4013e-45) {
            if ((bVar8) && (bVar10)) {
              for (k = 0; k < A->ncol; k = k + 1) {
                cy[k].r = cy[k].r * C[k];
                cy[k].i = cy[k].i * C[k];
              }
            }
            else if ((!bVar8) && (bVar9)) {
              for (k = 0; k < A->nrow; k = k + 1) {
                cy[k].r = cy[k].r * R[k];
                cy[k].i = cy[k].i * R[k];
              }
            }
            cgstrs((trans_t)work,L,U,perm_c,perm_r,(SuperMatrix *)&Bstore,stat,info);
            for (k = 0; k < A->nrow; k = k + 1) {
              cy[k].r = cy[k].r * *(float *)((long)addr + (long)k * 4);
              cy[k].i = cy[k].i * *(float *)((long)addr + (long)k * 4);
            }
          }
          else {
            for (k = 0; k < A->nrow; k = k + 1) {
              cy[k].r = cy[k].r * *(float *)((long)addr + (long)k * 4);
              cy[k].i = cy[k].i * *(float *)((long)addr + (long)k * 4);
            }
            cgstrs(trans,L,U,perm_c,perm_r,(SuperMatrix *)&Bstore,stat,info);
            if ((bVar8) && (bVar10)) {
              for (k = 0; k < A->ncol; k = k + 1) {
                cy[k].r = cy[k].r * C[k];
                cy[k].i = cy[k].i * C[k];
              }
            }
            else if ((!bVar8) && (bVar9)) {
              for (k = 0; k < A->ncol; k = k + 1) {
                cy[k].r = cy[k].r * R[k];
                cy[k].i = cy[k].i * R[k];
              }
            }
          }
        } while (safe2 != 0.0);
        safmin = 0.0;
        if ((bVar8) && (bVar10)) {
          for (k = 0; k < A->nrow; k = k + 1) {
            fVar1 = C[k];
            dVar11 = c_abs1(_safe1 + k);
            if ((double)safmin <= (double)fVar1 * dVar11) {
              fVar1 = C[k];
              local_390 = c_abs1(_safe1 + k);
              local_390 = (double)fVar1 * local_390;
            }
            else {
              local_390 = (double)safmin;
            }
            safmin = (float)local_390;
          }
        }
        else if ((bVar8) || (!bVar9)) {
          for (k = 0; k < A->nrow; k = k + 1) {
            dVar11 = c_abs1(_safe1 + k);
            if ((double)safmin <= dVar11) {
              local_3c8 = c_abs1(_safe1 + k);
            }
            else {
              local_3c8 = (double)safmin;
            }
            safmin = (float)local_3c8;
          }
        }
        else {
          for (k = 0; k < A->nrow; k = k + 1) {
            fVar1 = R[k];
            dVar11 = c_abs1(_safe1 + k);
            if ((double)safmin <= (double)fVar1 * dVar11) {
              fVar1 = R[k];
              local_3b0 = c_abs1(_safe1 + k);
              local_3b0 = (double)fVar1 * local_3b0;
            }
            else {
              local_3b0 = (double)safmin;
            }
            safmin = (float)local_3b0;
          }
        }
        if ((safmin != 0.0) || (NAN(safmin))) {
          ferr[irow] = ferr[irow] / safmin;
        }
      }
      superlu_free(cy);
      superlu_free(addr);
      superlu_free(addr_00);
      superlu_free((void *)Bjcol._16_8_);
    }
  }
  else {
    k = -*info;
    input_error("cgsrfs",&k);
  }
  return;
}

Assistant:

void
cgsrfs(trans_t trans, SuperMatrix *A, SuperMatrix *L, SuperMatrix *U,
       int *perm_c, int *perm_r, char *equed, float *R, float *C,
       SuperMatrix *B, SuperMatrix *X, float *ferr, float *berr,
       SuperLUStat_t *stat, int *info)
{


#define ITMAX 5
    
    /* Table of constant values */
    int    ione = 1, nrow = A->nrow;
    singlecomplex ndone = {-1., 0.};
    singlecomplex done = {1., 0.};
    
    /* Local variables */
    NCformat *Astore;
    singlecomplex   *Aval;
    SuperMatrix Bjcol;
    DNformat *Bstore, *Xstore, *Bjcol_store;
    singlecomplex   *Bmat, *Xmat, *Bptr, *Xptr;
    int      kase;
    float   safe1, safe2;
    int      i, j, k, irow, nz, count, notran, rowequ, colequ;
    int      ldb, ldx, nrhs;
    float   s, xk, lstres, eps, safmin;
    char     transc[1];
    trans_t  transt;
    singlecomplex   *work;
    float   *rwork;
    int      *iwork;
    int      isave[3];

    extern int clacon2_(int *, singlecomplex *, singlecomplex *, float *, int *, int []);

    Astore = A->Store;
    Aval   = Astore->nzval;
    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;
    
    /* Test the input parameters */
    *info = 0;
    notran = (trans == NOTRANS);
    if ( !notran && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      A->Stype != SLU_NC || A->Dtype != SLU_C || A->Mtype != SLU_GE )
	*info = -2;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
 	      L->Stype != SLU_SC || L->Dtype != SLU_C || L->Mtype != SLU_TRLU )
	*info = -3;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
 	      U->Stype != SLU_NC || U->Dtype != SLU_C || U->Mtype != SLU_TRU )
	*info = -4;
    else if ( ldb < SUPERLU_MAX(0, A->nrow) ||
 	      B->Stype != SLU_DN || B->Dtype != SLU_C || B->Mtype != SLU_GE )
        *info = -10;
    else if ( ldx < SUPERLU_MAX(0, A->nrow) ||
 	      X->Stype != SLU_DN || X->Dtype != SLU_C || X->Mtype != SLU_GE )
	*info = -11;
    if (*info != 0) {
	i = -(*info);
	input_error("cgsrfs", &i);
	return;
    }

    /* Quick return if possible */
    if ( A->nrow == 0 || nrhs == 0) {
	for (j = 0; j < nrhs; ++j) {
	    ferr[j] = 0.;
	    berr[j] = 0.;
	}
	return;
    }

    rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
    colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
    
    /* Allocate working space */
    work = singlecomplexMalloc(2*A->nrow);
    rwork = (float *) SUPERLU_MALLOC( A->nrow * sizeof(float) );
    iwork = int32Malloc(A->nrow);
    if ( !work || !rwork || !iwork ) 
        ABORT("Malloc fails for work/rwork/iwork.");
    
    if ( notran ) {
	*(unsigned char *)transc = 'N';
        transt = TRANS;
    } else if ( trans == TRANS ) {
	*(unsigned char *)transc = 'T';
	transt = NOTRANS;
    } else if ( trans == CONJ ) {
	*(unsigned char *)transc = 'C';
	transt = NOTRANS;
    }    

    /* NZ = maximum number of nonzero elements in each row of A, plus 1 */
    nz     = A->ncol + 1;
    eps    = smach("Epsilon");
    safmin = smach("Safe minimum");

    /* Set SAFE1 essentially to be the underflow threshold times the
       number of additions in each row. */
    safe1  = nz * safmin;
    safe2  = safe1 / eps;

    /* Compute the number of nonzeros in each row (or column) of A */
    for (i = 0; i < A->nrow; ++i) iwork[i] = 0;
    if ( notran ) {
	for (k = 0; k < A->ncol; ++k)
	    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) 
		++iwork[Astore->rowind[i]];
    } else {
	for (k = 0; k < A->ncol; ++k)
	    iwork[k] = Astore->colptr[k+1] - Astore->colptr[k];
    }	

    /* Copy one column of RHS B into Bjcol. */
    Bjcol.Stype = B->Stype;
    Bjcol.Dtype = B->Dtype;
    Bjcol.Mtype = B->Mtype;
    Bjcol.nrow  = B->nrow;
    Bjcol.ncol  = 1;
    Bjcol.Store = (void *) SUPERLU_MALLOC( sizeof(DNformat) );
    if ( !Bjcol.Store ) ABORT("SUPERLU_MALLOC fails for Bjcol.Store");
    Bjcol_store = Bjcol.Store;
    Bjcol_store->lda = ldb;
    Bjcol_store->nzval = work; /* address aliasing */
	
    /* Do for each right hand side ... */
    for (j = 0; j < nrhs; ++j) {
	count = 0;
	lstres = 3.;
	Bptr = &Bmat[j*ldb];
	Xptr = &Xmat[j*ldx];

	while (1) { /* Loop until stopping criterion is satisfied. */

	    /* Compute residual R = B - op(A) * X,   
	       where op(A) = A, A**T, or A**H, depending on TRANS. */
	    
#ifdef _CRAY
	    CCOPY(&nrow, Bptr, &ione, work, &ione);
#else
	    ccopy_(&nrow, Bptr, &ione, work, &ione);
#endif
	    sp_cgemv(transc, ndone, A, Xptr, ione, done, work, ione);

	    /* Compute componentwise relative backward error from formula 
	       max(i) ( abs(R(i)) / ( abs(op(A))*abs(X) + abs(B) )(i) )   
	       where abs(Z) is the componentwise absolute value of the matrix
	       or vector Z.  If the i-th component of the denominator is less
	       than SAFE2, then SAFE1 is added to the i-th component of the   
	       numerator before dividing. */

	    for (i = 0; i < A->nrow; ++i) rwork[i] = c_abs1( &Bptr[i] );
	    
	    /* Compute abs(op(A))*abs(X) + abs(B). */
	    if ( notran ) {
		for (k = 0; k < A->ncol; ++k) {
		    xk = c_abs1( &Xptr[k] );
		    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i)
			rwork[Astore->rowind[i]] += c_abs1(&Aval[i]) * xk;
		}
	    } else {  /* trans = TRANS or CONJ */
		for (k = 0; k < A->ncol; ++k) {
		    s = 0.;
		    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) {
			irow = Astore->rowind[i];
			s += c_abs1(&Aval[i]) * c_abs1(&Xptr[irow]);
		    }
		    rwork[k] += s;
		}
	    }
	    s = 0.;
	    for (i = 0; i < A->nrow; ++i) {
		if (rwork[i] > safe2) {
		    s = SUPERLU_MAX( s, c_abs1(&work[i]) / rwork[i] );
                } else if ( rwork[i] != 0.0 ) {
		    s = SUPERLU_MAX( s, (c_abs1(&work[i]) + safe1) / rwork[i] );
                }
                /* If rwork[i] is exactly 0.0, then we know the true 
                   residual also must be exactly 0.0. */
	    }
	    berr[j] = s;

	    /* Test stopping criterion. Continue iterating if   
	       1) The residual BERR(J) is larger than machine epsilon, and   
	       2) BERR(J) decreased by at least a factor of 2 during the   
	          last iteration, and   
	       3) At most ITMAX iterations tried. */

	    if (berr[j] > eps && berr[j] * 2. <= lstres && count < ITMAX) {
		/* Update solution and try again. */
		cgstrs (trans, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
#ifdef _CRAY
		CAXPY(&nrow, &done, work, &ione,
		       &Xmat[j*ldx], &ione);
#else
		caxpy_(&nrow, &done, work, &ione,
		       &Xmat[j*ldx], &ione);
#endif
		lstres = berr[j];
		++count;
	    } else {
		break;
	    }
        
	} /* end while */

	stat->RefineSteps = count;

	/* Bound error from formula:
	   norm(X - XTRUE) / norm(X) .le. FERR = norm( abs(inv(op(A)))*   
	   ( abs(R) + NZ*EPS*( abs(op(A))*abs(X)+abs(B) ))) / norm(X)   
          where   
            norm(Z) is the magnitude of the largest component of Z   
            inv(op(A)) is the inverse of op(A)   
            abs(Z) is the componentwise absolute value of the matrix or
	       vector Z   
            NZ is the maximum number of nonzeros in any row of A, plus 1   
            EPS is machine epsilon   

          The i-th component of abs(R)+NZ*EPS*(abs(op(A))*abs(X)+abs(B))   
          is incremented by SAFE1 if the i-th component of   
          abs(op(A))*abs(X) + abs(B) is less than SAFE2.   

          Use CLACON2 to estimate the infinity-norm of the matrix   
             inv(op(A)) * diag(W),   
          where W = abs(R) + NZ*EPS*( abs(op(A))*abs(X)+abs(B) ))) */
	
	for (i = 0; i < A->nrow; ++i) rwork[i] = c_abs1( &Bptr[i] );
	
	/* Compute abs(op(A))*abs(X) + abs(B). */
	if ( notran ) {
	    for (k = 0; k < A->ncol; ++k) {
		xk = c_abs1( &Xptr[k] );
		for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i)
		    rwork[Astore->rowind[i]] += c_abs1(&Aval[i]) * xk;
	    }
	} else {  /* trans == TRANS or CONJ */
	    for (k = 0; k < A->ncol; ++k) {
		s = 0.;
		for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) {
		    irow = Astore->rowind[i];
		    xk = c_abs1( &Xptr[irow] );
		    s += c_abs1(&Aval[i]) * xk;
		}
		rwork[k] += s;
	    }
	}
	
	for (i = 0; i < A->nrow; ++i)
	    if (rwork[i] > safe2)
		rwork[i] = c_abs(&work[i]) + (iwork[i]+1)*eps*rwork[i];
	    else
		rwork[i] = c_abs(&work[i])+(iwork[i]+1)*eps*rwork[i]+safe1;
	kase = 0;

	do {
	    clacon2_(&nrow, &work[A->nrow], work, &ferr[j], &kase, isave);
	    if (kase == 0) break;

	    if (kase == 1) {
		/* Multiply by diag(W)*inv(op(A)**T)*(diag(C) or diag(R)). */
		if ( notran && colequ )
		    for (i = 0; i < A->ncol; ++i) {
		        cs_mult(&work[i], &work[i], C[i]);
	            }
		else if ( !notran && rowequ )
		    for (i = 0; i < A->nrow; ++i) {
		        cs_mult(&work[i], &work[i], R[i]);
                    }

		cgstrs (transt, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
		for (i = 0; i < A->nrow; ++i) {
		    cs_mult(&work[i], &work[i], rwork[i]);
	 	}
	    } else {
		/* Multiply by (diag(C) or diag(R))*inv(op(A))*diag(W). */
		for (i = 0; i < A->nrow; ++i) {
		    cs_mult(&work[i], &work[i], rwork[i]);
		}
		
		cgstrs (trans, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
		if ( notran && colequ )
		    for (i = 0; i < A->ncol; ++i) {
		        cs_mult(&work[i], &work[i], C[i]);
		    }
		else if ( !notran && rowequ )
		    for (i = 0; i < A->ncol; ++i) {
		        cs_mult(&work[i], &work[i], R[i]);  
		    }
	    }
	    
	} while ( kase != 0 );

	/* Normalize error. */
	lstres = 0.;
 	if ( notran && colequ ) {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, C[i] * c_abs1( &Xptr[i]) );
  	} else if ( !notran && rowequ ) {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, R[i] * c_abs1( &Xptr[i]) );
	} else {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, c_abs1( &Xptr[i]) );
	}
	if ( lstres != 0. )
	    ferr[j] /= lstres;

    } /* for each RHS j ... */
    
    SUPERLU_FREE(work);
    SUPERLU_FREE(rwork);
    SUPERLU_FREE(iwork);
    SUPERLU_FREE(Bjcol.Store);

    return;

}